

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<double>::ComputeEigenvectorsInternal(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  double *eigenvalue;
  TPZManVector<double,_3> *result;
  TPZManVector<double,_3> *pTVar1;
  TPZManVector<double,_3> *x1;
  
  (*(eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>._vptr_TPZVec[4])
            (&eigensystem->fEigenvectors,3);
  pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
  (*(pTVar1->super_TPZVec<double>)._vptr_TPZVec[4])(pTVar1,3);
  pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
  (*pTVar1[1].super_TPZVec<double>._vptr_TPZVec[4])(pTVar1 + 1,3);
  pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
  (*pTVar1[2].super_TPZVec<double>._vptr_TPZVec[4])(pTVar1 + 2,3);
  eigenvalue = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
  if (*(eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore == 1) {
    ComputeEigenvector0(this,eigenvalue,
                        (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore);
    pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
    ComputeEigenvector1(this,pTVar1,(eigensystem->fEigenvalues).super_TPZVec<double>.fStore + 1,
                        pTVar1 + 1);
    x1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
    pTVar1 = x1 + 1;
    result = x1 + 2;
  }
  else {
    ComputeEigenvector0(this,eigenvalue + 2,
                        (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore +
                        2);
    pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
    ComputeEigenvector1(this,pTVar1 + 2,(eigensystem->fEigenvalues).super_TPZVec<double>.fStore + 1,
                        pTVar1 + 1);
    result = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
    x1 = result + 1;
    pTVar1 = result + 2;
  }
  Cross<double>(&x1->super_TPZVec<double>,&pTVar1->super_TPZVec<double>,
                &result->super_TPZVec<double>);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvectorsInternal(TPZDecomposed &eigensystem) const {
    TPZManVector<T, 3> &eigenval = eigensystem.fEigenvalues;
    TPZManVector<TPZManVector<T, 3>, 3> &eigenvec = eigensystem.fEigenvectors;

    eigenvec.resize(3);
    eigenvec[0].resize(3);
    eigenvec[1].resize(3);
    eigenvec[2].resize(3);
    // Compute the eigenvectors so that the set {evec[0], evec[1], evec[2]}
    // is right handed and orthonormal.
    if (eigensystem.fGeometricMultiplicity[0] == 1) {
        ComputeEigenvector0(eigenval[0], eigenvec[0]);
        ComputeEigenvector1(eigenvec[0], eigenval[1], eigenvec[1]);
        Cross(eigenvec[0], eigenvec[1], eigenvec[2]);
    } else {
        ComputeEigenvector0(eigenval[2], eigenvec[2]);
        ComputeEigenvector1(eigenvec[2], eigenval[1], eigenvec[1]);
        Cross(eigenvec[1], eigenvec[2], eigenvec[0]);
    }
}